

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

MacroActualArgumentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroActualArgumentSyntax,nonstd::span_lite::span<slang::parsing::Token,18446744073709551615ul>&>
          (BumpAllocator *this,span<slang::parsing::Token,_18446744073709551615UL> *args)

{
  MacroActualArgumentSyntax *this_00;
  TokenList local_48;
  span<slang::parsing::Token,_18446744073709551615UL> *local_18;
  span<slang::parsing::Token,_18446744073709551615UL> *args_local;
  BumpAllocator *this_local;
  
  local_18 = args;
  args_local = (span<slang::parsing::Token,_18446744073709551615UL> *)this;
  this_00 = (MacroActualArgumentSyntax *)allocate(this,0x40,8);
  slang::syntax::TokenList::TokenList(&local_48,*local_18);
  slang::syntax::MacroActualArgumentSyntax::MacroActualArgumentSyntax(this_00,&local_48);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }